

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

void y4m_convert_411_420jpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte *in_RDX;
  int *in_RDI;
  int x;
  int y;
  int pli;
  int tmp_sz;
  int dst_c_sz;
  int dst_c_h;
  int dst_c_w;
  int c_sz;
  int c_h;
  int c_w;
  uchar *tmp;
  byte local_244;
  int local_240;
  byte local_22c;
  int local_228;
  int local_218;
  int local_204;
  int local_200;
  byte local_1ec;
  int local_1e8;
  byte local_1d4;
  int local_1d0;
  int local_1c0;
  int local_1ac;
  int local_1a8;
  byte local_194;
  byte local_190;
  int local_18c;
  byte local_188;
  byte local_184;
  int local_180;
  byte local_17c;
  int local_178;
  int local_168;
  byte local_154;
  int local_150;
  int local_140;
  int local_130;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  byte *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int local_108;
  int local_f8;
  byte local_e4;
  int local_e0;
  int local_d0;
  byte local_bc;
  int local_b8;
  int local_a8;
  int local_98;
  int local_88;
  int local_74;
  int local_70;
  int local_60;
  int local_50;
  int local_48;
  int local_44;
  int local_40;
  byte *local_20;
  byte *local_18;
  
  iVar2 = (*in_RDI + in_RDI[7] + -1) / in_RDI[7];
  iVar1 = in_RDI[1];
  iVar3 = (*in_RDI + in_RDI[9] + -1) / in_RDI[9];
  local_20 = in_RDX + iVar2 * iVar1 * 2;
  local_18 = in_RDX;
  for (local_40 = 1; local_40 < 3; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
      local_48 = 0;
      while( true ) {
        local_50 = iVar2;
        if (1 < iVar2) {
          local_50 = 1;
        }
        if (local_50 <= local_48) break;
        if (iVar2 + -1 < 1) {
          local_60 = iVar2 + -1;
        }
        else {
          local_60 = 1;
        }
        if (iVar2 + -1 < 2) {
          local_70 = iVar2 + -1;
        }
        else {
          local_70 = 2;
        }
        if ((int)((((uint)*local_18 * 0x6f + (uint)local_18[local_60] * 0x12) -
                  (uint)local_18[local_70]) + 0x40) >> 7 < 0x100) {
          if (iVar2 + -1 < 1) {
            local_88 = iVar2 + -1;
          }
          else {
            local_88 = 1;
          }
          if (iVar2 + -1 < 2) {
            local_98 = iVar2 + -1;
          }
          else {
            local_98 = 2;
          }
          local_74 = (int)((((uint)*local_18 * 0x6f + (uint)local_18[local_88] * 0x12) -
                           (uint)local_18[local_98]) + 0x40) >> 7;
        }
        else {
          local_74 = 0xff;
        }
        if (local_74 < 1) {
          local_e4 = 0;
        }
        else {
          if (iVar2 + -1 < 1) {
            local_a8 = iVar2 + -1;
          }
          else {
            local_a8 = 1;
          }
          if (iVar2 + -1 < 2) {
            local_b8 = iVar2 + -1;
          }
          else {
            local_b8 = 2;
          }
          if ((int)((((uint)*local_18 * 0x6f + (uint)local_18[local_a8] * 0x12) -
                    (uint)local_18[local_b8]) + 0x40) >> 7 < 0x100) {
            if (iVar2 + -1 < 1) {
              local_d0 = iVar2 + -1;
            }
            else {
              local_d0 = 1;
            }
            if (iVar2 + -1 < 2) {
              local_e0 = iVar2 + -1;
            }
            else {
              local_e0 = 2;
            }
            local_bc = (byte)((int)((((uint)*local_18 * 0x6f + (uint)local_18[local_d0] * 0x12) -
                                    (uint)local_18[local_e0]) + 0x40) >> 7);
          }
          else {
            local_bc = 0xff;
          }
          local_e4 = local_bc;
        }
        local_20[local_48 << 1] = local_e4;
        if (iVar2 + -1 < 1) {
          local_f8 = iVar2 + -1;
        }
        else {
          local_f8 = 1;
        }
        if (iVar2 + -1 < 2) {
          local_108 = iVar2 + -1;
        }
        else {
          local_108 = 2;
        }
        if ((int)((uint)*local_18 * 0x2f + (uint)local_18[local_f8] * 0x56 +
                  (uint)local_18[local_108] * -5 + 0x40) >> 7 < 0x100) {
          in_stack_fffffffffffffee4 = (uint)*local_18 * 0x2f;
          if (iVar2 + -1 < 1) {
            in_stack_fffffffffffffee0 = iVar2 + -1;
          }
          else {
            in_stack_fffffffffffffee0 = 1;
          }
          if (iVar2 + -1 < 2) {
            local_130 = iVar2 + -1;
          }
          else {
            local_130 = 2;
          }
          in_stack_fffffffffffffef4 =
               (int)(in_stack_fffffffffffffee4 + (uint)local_18[in_stack_fffffffffffffee0] * 0x56 +
                     (uint)local_18[local_130] * -5 + 0x40) >> 7;
          in_stack_fffffffffffffee8 = local_18;
        }
        else {
          in_stack_fffffffffffffef4 = 0xff;
        }
        if (in_stack_fffffffffffffef4 < 1) {
          local_17c = 0;
        }
        else {
          if (iVar2 + -1 < 1) {
            local_140 = iVar2 + -1;
          }
          else {
            local_140 = 1;
          }
          if (iVar2 + -1 < 2) {
            local_150 = iVar2 + -1;
          }
          else {
            local_150 = 2;
          }
          if ((int)((uint)*local_18 * 0x2f + (uint)local_18[local_140] * 0x56 +
                    (uint)local_18[local_150] * -5 + 0x40) >> 7 < 0x100) {
            if (iVar2 + -1 < 1) {
              local_168 = iVar2 + -1;
            }
            else {
              local_168 = 1;
            }
            if (iVar2 + -1 < 2) {
              local_178 = iVar2 + -1;
            }
            else {
              local_178 = 2;
            }
            local_154 = (byte)((int)((uint)*local_18 * 0x2f + (uint)local_18[local_168] * 0x56 +
                                     (uint)local_18[local_178] * -5 + 0x40) >> 7);
          }
          else {
            local_154 = 0xff;
          }
          local_17c = local_154;
        }
        local_20[(int)(local_48 << 1 | 1)] = local_17c;
        local_48 = local_48 + 1;
      }
      for (; local_48 < iVar2 + -2; local_48 = local_48 + 1) {
        if ((int)((((uint)local_18[local_48 + -1] + (uint)local_18[local_48] * 0x6e +
                   (uint)local_18[local_48 + 1] * 0x12) - (uint)local_18[local_48 + 2]) + 0x40) >> 7
            < 0x100) {
          local_180 = (int)((((uint)local_18[local_48 + -1] + (uint)local_18[local_48] * 0x6e +
                             (uint)local_18[local_48 + 1] * 0x12) - (uint)local_18[local_48 + 2]) +
                           0x40) >> 7;
        }
        else {
          local_180 = 0xff;
        }
        if (local_180 < 1) {
          local_188 = 0;
        }
        else {
          if ((int)((((uint)local_18[local_48 + -1] + (uint)local_18[local_48] * 0x6e +
                     (uint)local_18[local_48 + 1] * 0x12) - (uint)local_18[local_48 + 2]) + 0x40) >>
              7 < 0x100) {
            local_184 = (byte)((int)((((uint)local_18[local_48 + -1] +
                                       (uint)local_18[local_48] * 0x6e +
                                      (uint)local_18[local_48 + 1] * 0x12) -
                                     (uint)local_18[local_48 + 2]) + 0x40) >> 7);
          }
          else {
            local_184 = 0xff;
          }
          local_188 = local_184;
        }
        local_20[local_48 << 1] = local_188;
        if ((int)((uint)local_18[local_48 + -1] * -3 + (uint)local_18[local_48] * 0x32 +
                  (uint)local_18[local_48 + 1] * 0x56 + (uint)local_18[local_48 + 2] * -5 + 0x40) >>
            7 < 0x100) {
          local_18c = (int)((uint)local_18[local_48 + -1] * -3 + (uint)local_18[local_48] * 0x32 +
                            (uint)local_18[local_48 + 1] * 0x56 + (uint)local_18[local_48 + 2] * -5
                           + 0x40) >> 7;
        }
        else {
          local_18c = 0xff;
        }
        if (local_18c < 1) {
          local_194 = 0;
        }
        else {
          if ((int)((uint)local_18[local_48 + -1] * -3 + (uint)local_18[local_48] * 0x32 +
                    (uint)local_18[local_48 + 1] * 0x56 + (uint)local_18[local_48 + 2] * -5 + 0x40)
              >> 7 < 0x100) {
            local_190 = (byte)((int)((uint)local_18[local_48 + -1] * -3 +
                                     (uint)local_18[local_48] * 0x32 +
                                     (uint)local_18[local_48 + 1] * 0x56 +
                                     (uint)local_18[local_48 + 2] * -5 + 0x40) >> 7);
          }
          else {
            local_190 = 0xff;
          }
          local_194 = local_190;
        }
        local_20[(int)(local_48 << 1 | 1)] = local_194;
      }
      for (; local_48 < iVar2; local_48 = local_48 + 1) {
        if (iVar2 + -1 < local_48 + 1) {
          local_1a8 = iVar2 + -1;
        }
        else {
          local_1a8 = local_48 + 1;
        }
        if ((int)((((uint)local_18[local_48 + -1] + (uint)local_18[local_48] * 0x6e +
                   (uint)local_18[local_1a8] * 0x12) - (uint)local_18[iVar2 + -1]) + 0x40) >> 7 <
            0x100) {
          if (iVar2 + -1 < local_48 + 1) {
            local_1c0 = iVar2 + -1;
          }
          else {
            local_1c0 = local_48 + 1;
          }
          local_1ac = (int)((((uint)local_18[local_48 + -1] + (uint)local_18[local_48] * 0x6e +
                             (uint)local_18[local_1c0] * 0x12) - (uint)local_18[iVar2 + -1]) + 0x40)
                      >> 7;
        }
        else {
          local_1ac = 0xff;
        }
        if (local_1ac < 1) {
          local_1ec = 0;
        }
        else {
          if (iVar2 + -1 < local_48 + 1) {
            local_1d0 = iVar2 + -1;
          }
          else {
            local_1d0 = local_48 + 1;
          }
          if ((int)((((uint)local_18[local_48 + -1] + (uint)local_18[local_48] * 0x6e +
                     (uint)local_18[local_1d0] * 0x12) - (uint)local_18[iVar2 + -1]) + 0x40) >> 7 <
              0x100) {
            if (iVar2 + -1 < local_48 + 1) {
              local_1e8 = iVar2 + -1;
            }
            else {
              local_1e8 = local_48 + 1;
            }
            local_1d4 = (byte)((int)((((uint)local_18[local_48 + -1] +
                                       (uint)local_18[local_48] * 0x6e +
                                      (uint)local_18[local_1e8] * 0x12) - (uint)local_18[iVar2 + -1]
                                     ) + 0x40) >> 7);
          }
          else {
            local_1d4 = 0xff;
          }
          local_1ec = local_1d4;
        }
        local_20[local_48 << 1] = local_1ec;
        if ((int)(local_48 << 1 | 1U) < iVar3) {
          if (iVar2 + -1 < local_48 + 1) {
            local_200 = iVar2 + -1;
          }
          else {
            local_200 = local_48 + 1;
          }
          if ((int)((uint)local_18[local_48 + -1] * -3 + (uint)local_18[local_48] * 0x32 +
                    (uint)local_18[local_200] * 0x56 + (uint)local_18[iVar2 + -1] * -5 + 0x40) >> 7
              < 0x100) {
            if (iVar2 + -1 < local_48 + 1) {
              local_218 = iVar2 + -1;
            }
            else {
              local_218 = local_48 + 1;
            }
            local_204 = (int)((uint)local_18[local_48 + -1] * -3 + (uint)local_18[local_48] * 0x32 +
                              (uint)local_18[local_218] * 0x56 + (uint)local_18[iVar2 + -1] * -5 +
                             0x40) >> 7;
          }
          else {
            local_204 = 0xff;
          }
          if (local_204 < 1) {
            local_244 = 0;
          }
          else {
            if (iVar2 + -1 < local_48 + 1) {
              local_228 = iVar2 + -1;
            }
            else {
              local_228 = local_48 + 1;
            }
            if ((int)((uint)local_18[local_48 + -1] * -3 + (uint)local_18[local_48] * 0x32 +
                      (uint)local_18[local_228] * 0x56 + (uint)local_18[iVar2 + -1] * -5 + 0x40) >>
                7 < 0x100) {
              if (iVar2 + -1 < local_48 + 1) {
                local_240 = iVar2 + -1;
              }
              else {
                local_240 = local_48 + 1;
              }
              local_22c = (byte)((int)((uint)local_18[local_48 + -1] * -3 +
                                       (uint)local_18[local_48] * 0x32 +
                                       (uint)local_18[local_240] * 0x56 +
                                       (uint)local_18[iVar2 + -1] * -5 + 0x40) >> 7);
            }
            else {
              local_22c = 0xff;
            }
            local_244 = local_22c;
          }
          local_20[(int)(local_48 << 1 | 1)] = local_244;
        }
      }
      local_20 = local_20 + iVar3;
      local_18 = local_18 + iVar2;
    }
    local_20 = local_20 + -(long)(iVar3 * iVar1);
    y4m_422jpeg_420jpeg_helper
              ((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

static void y4m_convert_411_420jpeg(y4m_input *_y4m, unsigned char *_dst,
                                    unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int dst_c_w;
  int dst_c_h;
  int dst_c_sz;
  int tmp_sz;
  int pli;
  int y;
  int x;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + _y4m->src_c_dec_h - 1) / _y4m->src_c_dec_h;
  c_h = _y4m->pic_h;
  dst_c_w = (_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  dst_c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  dst_c_sz = dst_c_w * dst_c_h;
  tmp_sz = dst_c_w * c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*In reality, the horizontal and vertical steps could be pipelined, for
       less memory consumption and better cache performance, but we do them
       separately for simplicity.*/
    /*First do horizontal filtering (convert to 422jpeg)*/
    for (y = 0; y < c_h; y++) {
      /*Filters: [1 110 18 -1]/128 and [-3 50 86 -5]/128, both derived from a
         4-tap Mitchell window.*/
      for (x = 0; x < OC_MINI(c_w, 1); x++) {
        tmp[x << 1] = (unsigned char)OC_CLAMPI(
            0,
            (111 * _aux[0] + 18 * _aux[OC_MINI(1, c_w - 1)] -
             _aux[OC_MINI(2, c_w - 1)] + 64) >>
                7,
            255);
        tmp[x << 1 | 1] = (unsigned char)OC_CLAMPI(
            0,
            (47 * _aux[0] + 86 * _aux[OC_MINI(1, c_w - 1)] -
             5 * _aux[OC_MINI(2, c_w - 1)] + 64) >>
                7,
            255);
      }
      for (; x < c_w - 2; x++) {
        tmp[x << 1] =
            (unsigned char)OC_CLAMPI(0,
                                     (_aux[x - 1] + 110 * _aux[x] +
                                      18 * _aux[x + 1] - _aux[x + 2] + 64) >>
                                         7,
                                     255);
        tmp[x << 1 | 1] = (unsigned char)OC_CLAMPI(
            0,
            (-3 * _aux[x - 1] + 50 * _aux[x] + 86 * _aux[x + 1] -
             5 * _aux[x + 2] + 64) >>
                7,
            255);
      }
      for (; x < c_w; x++) {
        tmp[x << 1] = (unsigned char)OC_CLAMPI(
            0,
            (_aux[x - 1] + 110 * _aux[x] + 18 * _aux[OC_MINI(x + 1, c_w - 1)] -
             _aux[c_w - 1] + 64) >>
                7,
            255);
        if ((x << 1 | 1) < dst_c_w) {
          tmp[x << 1 | 1] = (unsigned char)OC_CLAMPI(
              0,
              (-3 * _aux[x - 1] + 50 * _aux[x] +
               86 * _aux[OC_MINI(x + 1, c_w - 1)] - 5 * _aux[c_w - 1] + 64) >>
                  7,
              255);
        }
      }
      tmp += dst_c_w;
      _aux += c_w;
    }
    tmp -= tmp_sz;
    /*Now do the vertical filtering.*/
    y4m_422jpeg_420jpeg_helper(_dst, tmp, dst_c_w, c_h);
    _dst += dst_c_sz;
  }
}